

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-test-part.cc
# Opt level: O3

ostream * testing::operator<<(ostream *os,TestPartResult *result)

{
  long lVar1;
  ostream *poVar2;
  size_t sVar3;
  char *pcVar4;
  char *__s;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar4 = (result->file_name_)._M_dataplus._M_p;
  if (pcVar4 == (char *)0x0 || (result->file_name_)._M_string_length == 0) {
    std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
  }
  else {
    sVar3 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar4,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,":",1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)os,result->line_number_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
  pcVar4 = "Non-fatal failure";
  if (result->type_ == kFatalFailure) {
    pcVar4 = "Fatal failure";
  }
  __s = "Success";
  if (result->type_ != kSuccess) {
    __s = pcVar4;
  }
  sVar3 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,":\n",2);
  pcVar4 = (result->message_)._M_dataplus._M_p;
  if (pcVar4 == (char *)0x0) {
    std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
  }
  else {
    sVar3 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,sVar3);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    poVar2 = (ostream *)std::ostream::flush();
    return poVar2;
  }
  __stack_chk_fail();
}

Assistant:

std::ostream& operator<<(std::ostream& os, const TestPartResult& result) {
  return os
      << result.file_name() << ":" << result.line_number() << ": "
      << (result.type() == TestPartResult::kSuccess ? "Success" :
          result.type() == TestPartResult::kFatalFailure ? "Fatal failure" :
          "Non-fatal failure") << ":\n"
      << result.message() << std::endl;
}